

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::qtpromise_defer<std::function<void()>const&>
               (function<void_()> *f,QPointer<QThread> *thread)

{
  QThread *pQVar1;
  ulong uVar2;
  QObject *pQVar3;
  QEvent *this;
  QObject *target;
  QPointer<QThread> *thread_local;
  function<void_()> *f_local;
  
  pQVar1 = QPointer::operator_cast_to_QThread_((QPointer *)thread);
  if (pQVar1 != (QThread *)0x0) {
    QPointer<QThread>::operator->(thread);
    uVar2 = QThread::isFinished();
    if ((uVar2 & 1) == 0) {
      pQVar1 = QPointer::operator_cast_to_QThread_((QPointer *)thread);
      pQVar3 = (QObject *)QAbstractEventDispatcher::instance(pQVar1);
      if ((pQVar3 != (QObject *)0x0) || (uVar2 = QCoreApplication::closingDown(), (uVar2 & 1) == 0))
      {
        this = (QEvent *)operator_new(0x30);
        qtpromise_defer<std::function<void()>const&>(std::
        function<void()>const&,QPointer<QThread>const&)::Event::Event(std::function<void()>_const__
                  (this,f);
        QCoreApplication::postEvent(pQVar3,this,0);
      }
    }
  }
  return;
}

Assistant:

static void qtpromise_defer(F&& f, const QPointer<QThread>& thread)
{
    using FType = typename std::decay<F>::type;

    struct Event : public QEvent
    {
        Event(FType&& f) : QEvent{QEvent::None}, m_f{std::move(f)} { }
        Event(const FType& f) : QEvent{QEvent::None}, m_f{f} { }
        ~Event() override { m_f(); }
        FType m_f;
    };

    if (!thread || thread->isFinished()) {
        // Make sure to not call `f` if the captured thread doesn't exist anymore,
        // which would potentially result in dispatching to the wrong thread (ie.
        // nullptr == current thread). Since the target thread is gone, it should
        // be safe to simply skip that notification.
        return;
    }

    QObject* target = QAbstractEventDispatcher::instance(thread);
    if (!target && QCoreApplication::closingDown()) {
        // When the app is shutting down, the even loop is not anymore available
        // so we don't have any way to dispatch `f`. This case can happen when a
        // promise is resolved after the app is requested to close, in which case
        // we should not trigger any error and skip that notification.
        return;
    }

    Q_ASSERT_X(target, "postMetaCall", "Target thread must have an event loop");
    QCoreApplication::postEvent(target, new Event{std::forward<F>(f)});
}